

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  _func_int *p_Var1;
  long lVar2;
  WallTime WVar3;
  int iVar4;
  undefined1 *puVar5;
  LogMessageData *pLVar6;
  int *piVar7;
  char *pcVar8;
  ostream *poVar9;
  long *this_00;
  _func_int **pp_Var10;
  undefined8 in_R9;
  LogStream *pLVar11;
  long *in_FS_OFFSET;
  string stacktrace;
  MutexLock l;
  string local_d8;
  MutexLock local_b8 [17];
  
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == 3) && (exit_on_dfatal != '\0')) {
    local_b8[0].mu_ = (Mutex *)fatal_msg_lock;
    if (fatal_msg_lock[0x38] == '\x01') {
      iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)fatal_msg_lock);
      if (iVar4 != 0) {
        abort();
      }
    }
    if (fatal_msg_exclusive == '\0') {
      fatal_msg_exclusive = '\x01';
      fatal_msg_data_exclusive[0x7721] = 1;
      puVar5 = fatal_msg_data_exclusive;
    }
    else {
      DAT_001429d9 = 0;
      puVar5 = (undefined1 *)&fatal_msg_data_shared;
    }
    this->data_ = (LogMessageData *)puVar5;
    ::glog_internal_namespace_::MutexLock::~MutexLock(local_b8);
    pLVar6 = this->data_;
  }
  else {
    lVar2 = *in_FS_OFFSET;
    if (*(char *)(lVar2 + -0x7730) == '\x01') {
      *(undefined1 *)(lVar2 + -0x7730) = 0;
      pLVar6 = (LogMessageData *)(lVar2 + -0x7728);
      LogMessageData::LogMessageData(pLVar6);
    }
    else {
      pLVar6 = (LogMessageData *)operator_new(0x7728);
      LogMessageData::LogMessageData(pLVar6);
      this->allocated_ = pLVar6;
    }
    this->data_ = pLVar6;
    pLVar6->first_fatal_ = false;
  }
  pcVar8 = pLVar6->message_text_ +
           (long)((pLVar6->stream_).super_ostream._vptr_basic_ostream[-3] + -4);
  if (pcVar8[0x7619] == '\0') {
    std::ios::widen((char)pcVar8 + '8');
    pcVar8[0x7619] = 1;
    pLVar6 = this->data_;
  }
  pcVar8[0x7618] = 0x30;
  piVar7 = __errno_location();
  pLVar6->preserved_errno_ = *piVar7;
  pLVar6->severity_ = (char)severity;
  pLVar6->line_ = line;
  pLVar6->send_method_ = send_method;
  *(undefined8 *)&pLVar6->field_0x76a8 = in_R9;
  (pLVar6->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  WVar3 = glog_internal_namespace_::WallTime_Now();
  pLVar6 = this->data_;
  pLVar6->timestamp_ = (long)WVar3;
  localtime_r(&pLVar6->timestamp_,(tm *)&pLVar6->tm_time_);
  pLVar6 = this->data_;
  lVar2 = pLVar6->timestamp_;
  pLVar6->num_chars_to_log_ = 0;
  pLVar6->num_chars_to_syslog_ = 0;
  pcVar8 = glog_internal_namespace_::const_basename(file);
  pLVar6 = this->data_;
  pLVar6->basename_ = pcVar8;
  pLVar6->fullname_ = file;
  pLVar6->has_been_flushed_ = false;
  if ((line != -1) && (fLB::FLAGS_log_prefix != '\0')) {
    local_b8[0].mu_._0_1_ = **(undefined1 **)(LogSeverityNames + (long)severity * 8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (&(pLVar6->stream_).super_ostream,(char *)local_b8,1);
    *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
    this_00 = (long *)std::ostream::operator<<(poVar9,(this->data_->tm_time_).tm_mon + 1);
    *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(this_00,(this->data_->tm_time_).tm_mday);
    local_b8[0].mu_._0_1_ = 0x20;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_b8,1);
    *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->data_->tm_time_).tm_hour);
    local_b8[0].mu_._0_1_ = 0x3a;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_b8,1);
    *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->data_->tm_time_).tm_min);
    local_b8[0].mu_._0_1_ = 0x3a;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_b8,1);
    *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->data_->tm_time_).tm_sec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
    *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 6;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)((WVar3 - (double)lVar2) * 1000000.0));
    local_b8[0].mu_._0_1_ = 0x20;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_b8,1);
    pp_Var10 = poVar9->_vptr_basic_ostream;
    p_Var1 = (_func_int *)((long)&poVar9->_vptr_basic_ostream + (long)pp_Var10[-3]);
    if ((&poVar9->field_0xe1)[(long)pp_Var10[-3]] == '\0') {
      std::ios::widen((char)p_Var1);
      p_Var1[0xe1] = (code)0x1;
      pp_Var10 = poVar9->_vptr_basic_ostream;
    }
    p_Var1[0xe0] = (code)0x20;
    *(undefined8 *)(&poVar9->field_0x10 + (long)pp_Var10[-3]) = 5;
    glog_internal_namespace_::GetTID();
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    p_Var1 = (_func_int *)
             ((long)&poVar9->_vptr_basic_ostream + (long)poVar9->_vptr_basic_ostream[-3]);
    if ((&poVar9->field_0xe1)[(long)poVar9->_vptr_basic_ostream[-3]] == '\0') {
      std::ios::widen((char)p_Var1);
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x30;
    local_b8[0].mu_._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_b8,1);
    pLVar6 = this->data_;
  }
  pLVar6->num_prefix_chars_ =
       *(long *)&(pLVar6->stream_).super_ostream.field_0x30 -
       *(long *)&(pLVar6->stream_).super_ostream.field_0x28;
  if (fLS::FLAGS_log_backtrace_at_abi_cxx11_[1] != 0) {
    snprintf((char *)local_b8,0x80,"%s:%d",pLVar6->basename_,(ulong)(uint)line);
    iVar4 = strcmp((char *)*fLS::FLAGS_log_backtrace_at_abi_cxx11_,(char *)local_b8);
    if (iVar4 == 0) {
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      glog_internal_namespace_::DumpStackTraceToString(&local_d8);
      pLVar11 = &this->data_->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar11->super_ostream," (stacktrace:\n",0xe);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (&pLVar11->super_ostream,local_d8._M_dataplus._M_p,
                          local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file,
                      int line,
                      LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = NULL;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
#ifdef HAVE_ALIGNED_STORAGE
      data_ = new (&thread_msg_data) LogMessageData;
#else
      const uintptr_t kAlign = sizeof(void*) - 1;

      char* align_ptr =
          reinterpret_cast<char*>(reinterpret_cast<uintptr_t>(thread_msg_data + kAlign) & ~kAlign);
      data_ = new (align_ptr) LogMessageData;
      assert(reinterpret_cast<uintptr_t>(align_ptr) % sizeof(void*) == 0);
#endif
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    MutexLock l(&fatal_msg_lock);
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  stream().fill('0');
  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = NULL;
  data_->outvec_ = NULL;
  WallTime now = WallTime_Now();
  data_->timestamp_ = static_cast<time_t>(now);
  localtime_r(&data_->timestamp_, &data_->tm_time_);
  int usecs = static_cast<int>((now - data_->timestamp_) * 1000000);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I1018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    stream() << LogSeverityNames[severity][0]
             << setw(2) << 1+data_->tm_time_.tm_mon
             << setw(2) << data_->tm_time_.tm_mday
             << ' '
             << setw(2) << data_->tm_time_.tm_hour  << ':'
             << setw(2) << data_->tm_time_.tm_min   << ':'
             << setw(2) << data_->tm_time_.tm_sec   << "."
             << setw(6) << usecs
             << ' '
             << setfill(' ') << setw(5)
             << static_cast<unsigned int>(GetTID()) << setfill('0')
             << ' ';
             // @huihut delete file & line
            //  << data_->basename_ << ':' << data_->line_ << "] ";
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (!strcmp(FLAGS_log_backtrace_at.c_str(), fileline)) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}